

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O3

int __thiscall CheaterBotStrategy::cheaterFortify(CheaterBotStrategy *this)

{
  pointer ppCVar1;
  Country *pCVar2;
  pointer ppCVar3;
  pointer pcVar4;
  byte bVar5;
  byte bVar6;
  pointer ppCVar7;
  ostream *poVar8;
  PlayerState *pPVar9;
  Player *pPVar10;
  int iVar11;
  pointer ppCVar12;
  bool bVar13;
  long *local_58;
  long local_50;
  long local_48 [2];
  CheaterBotStrategy *local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "We have a cheater! They are fortifying all their countries with enemy neighbours",0x50
            );
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  pPVar10 = (this->super_PlayerStrategy).player;
  ppCVar12 = (pPVar10->pOwnedCountries->
             super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  ppCVar1 = (pPVar10->pOwnedCountries->
            super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar12 != ppCVar1) {
    local_38 = this;
    do {
      pCVar2 = *ppCVar12;
      ppCVar7 = (pCVar2->pAdjCountries->
                super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      ppCVar3 = (pCVar2->pAdjCountries->
                super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppCVar7 != ppCVar3) {
        bVar6 = 0;
        do {
          bVar5 = bVar6;
          bVar13 = *(*ppCVar7)->pPlayerOwnerId != *pCVar2->pPlayerOwnerId;
          ppCVar7 = ppCVar7 + 1;
          bVar6 = bVar5 | bVar13;
        } while (ppCVar7 != ppCVar3);
        if ((bool)(bVar5 | bVar13)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"[CHEATER] - Country ",0x14);
          pcVar4 = (pCVar2->cyName->_M_dataplus)._M_p;
          local_58 = local_48;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_58,pcVar4,pcVar4 + pCVar2->cyName->_M_string_length);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)local_58,local_50);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," had ",5);
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,*pCVar2->pNumberOfTroops);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," armies. It now has ",0x14);
          if (local_58 != local_48) {
            operator_delete(local_58,local_48[0] + 1);
          }
          iVar11 = *pCVar2->pNumberOfTroops;
          if (0 < iVar11) {
            iVar11 = iVar11 * 2;
            *pCVar2->pNumberOfTroops = iVar11;
          }
          poVar8 = (ostream *)std::ostream::operator<<(&std::cout,iVar11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," armies. -",10);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
        }
      }
      ppCVar12 = ppCVar12 + 1;
    } while (ppCVar12 != ppCVar1);
    pPVar10 = (local_38->super_PlayerStrategy).player;
    this = local_38;
  }
  operator_delete(pPVar10->currentState,4);
  pPVar9 = (PlayerState *)operator_new(4);
  *pPVar9 = IDLE;
  pPVar10->currentState = pPVar9;
  (*((this->super_PlayerStrategy).player)->strategy->_vptr_PlayerStrategy[5])();
  return 1;
}

Assistant:

int CheaterBotStrategy::cheaterFortify() {
    std::cout << "We have a cheater! They are fortifying all their countries with enemy neighbours" << std::endl;
    for (auto* country : *this->player->getOwnedCountries()) {
        bool canFortify = false;
        for (auto* neighbour : *country->getAdjCountries()) {
            if (neighbour->getPlayerOwnerID() != country->getPlayerOwnerID()) {
                canFortify = true;
            }
        }
        if (canFortify) {
            std::cout << "[CHEATER] - Country " << country->getCountryName() << " had " << country->getNumberOfTroops() << " armies. It now has ";
            //prevent overflow
            if(country->getNumberOfTroops() * 2 > 0 && country->getNumberOfTroops() * 2 < 2147483647){
                country->setNumberOfTroops(country->getNumberOfTroops() * 2);
            }
            std::cout << country->getNumberOfTroops() << " armies. -" << std::endl;
        }
    }
    player->setPlayerState(PlayerState::IDLE);
    player->getStrategy()->resetChoices();
    return PlayerAction::SUCCEEDED;
}